

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O1

void NormalizeInclude(cmMakefile *mf,string *inc)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  string *psVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  string local_a0;
  undefined8 local_80;
  undefined1 *local_78;
  undefined1 local_70 [32];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  undefined1 *local_38;
  size_type local_30;
  pointer local_28;
  
  uVar3 = std::__cxx11::string::find_first_not_of((char *)inc,0x698a1f,0);
  lVar4 = std::__cxx11::string::find_last_not_of((char *)inc,0x698a1f,0xffffffffffffffff);
  if (lVar4 == -1 || uVar3 == 0xffffffffffffffff) {
    inc->_M_string_length = 0;
    *(inc->_M_dataplus)._M_p = '\0';
  }
  else {
    std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar3);
    value._M_str = (inc->_M_dataplus)._M_p;
    value._M_len = inc->_M_string_length;
    bVar2 = cmValue::IsOff(value);
    if (!bVar2) {
      cmsys::SystemTools::ConvertToUnixSlashes(inc);
      bVar2 = cmsys::SystemTools::FileIsFullPath(inc);
      if ((!bVar2) &&
         (((inc->_M_string_length < 2 || (pcVar1 = (inc->_M_dataplus)._M_p, *pcVar1 != '$')) ||
          (pcVar1[1] != '<')))) {
        psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(mf);
        local_50._M_str = (psVar5->_M_dataplus)._M_p;
        local_50._M_len = psVar5->_M_string_length;
        local_78 = local_70;
        local_80 = 1;
        local_70[0] = 0x2f;
        local_40 = 1;
        local_28 = (inc->_M_dataplus)._M_p;
        local_30 = inc->_M_string_length;
        views._M_len = 3;
        views._M_array = &local_50;
        local_38 = local_78;
        cmCatViews_abi_cxx11_(&local_a0,views);
        std::__cxx11::string::operator=((string *)inc,(string *)&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

static void NormalizeInclude(cmMakefile& mf, std::string& inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b != std::string::npos) && (e != std::string::npos)) {
    inc.assign(inc, b, 1 + e - b); // copy the remaining substring
  } else {
    inc.clear();
    return;
  }

  if (!cmIsOff(inc)) {
    cmSystemTools::ConvertToUnixSlashes(inc);
    if (!cmSystemTools::FileIsFullPath(inc) &&
        !cmGeneratorExpression::StartsWithGeneratorExpression(inc)) {
      inc = cmStrCat(mf.GetCurrentSourceDirectory(), '/', inc);
    }
  }
}